

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

parameters __thiscall cpp_db::statement::get_parameters(statement *this)

{
  bool bVar1;
  db_exception *this_00;
  element_type *peVar2;
  statement *in_RSI;
  shared_ptr<cpp_db::driver_interface> local_68;
  unique_ptr<cpp_db::parameters_interface,_std::default_delete<cpp_db::parameters_interface>_>
  local_58;
  undefined1 local_4e;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  statement *this_local;
  parameters *params;
  
  this_local = this;
  bVar1 = is_prepared(in_RSI);
  if (bVar1) {
    local_4e = 0;
    parameters::parameters((parameters *)this);
    tools::lock_or_throw<cpp_db::driver_interface>
              ((tools *)&local_68,&in_RSI->driver_impl,"Invalid database driver");
    peVar2 = std::
             __shared_ptr_access<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_68);
    (*peVar2->_vptr_driver_interface[4])(&local_58,peVar2,&in_RSI->stmt_impl);
    std::
    unique_ptr<cpp_db::parameters_interface,_std::default_delete<cpp_db::parameters_interface>_>::
    operator=((unique_ptr<cpp_db::parameters_interface,_std::default_delete<cpp_db::parameters_interface>_>
               *)this,&local_58);
    std::
    unique_ptr<cpp_db::parameters_interface,_std::default_delete<cpp_db::parameters_interface>_>::
    ~unique_ptr(&local_58);
    std::shared_ptr<cpp_db::driver_interface>::~shared_ptr(&local_68);
    return (unique_ptr<cpp_db::parameters_interface,_std::default_delete<cpp_db::parameters_interface>_>
            )(unique_ptr<cpp_db::parameters_interface,_std::default_delete<cpp_db::parameters_interface>_>
              )this;
  }
  local_4d = 1;
  this_00 = (db_exception *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Statement not prepared!",&local_39);
  db_exception::db_exception(this_00,&local_38);
  local_4d = 0;
  __cxa_throw(this_00,&db_exception::typeinfo,db_exception::~db_exception);
}

Assistant:

parameters statement::get_parameters() const
{
	if (!is_prepared())
		throw db_exception("Statement not prepared!");

    parameters params;
    params.params_impl = tools::lock_or_throw(driver_impl, "Invalid database driver")->make_parameters(stmt_impl);
    return params;
}